

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_left_stepping.cpp
# Opt level: O3

void test_1d_static<30ul,30ul>(void)

{
  ulong uVar1;
  int line;
  char *expr2;
  int *t;
  unsigned_long *puVar2;
  value_type true_idx;
  int dptr [30];
  unsigned_long *local_c0;
  int *local_b8;
  unsigned_long *local_b0;
  unsigned_long local_a8 [15];
  
  local_a8[0] = CONCAT71(local_a8[0]._1_7_,1);
  local_c0 = (unsigned_long *)CONCAT71(local_c0._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0x25,"void test_1d_static() [N = 30UL, X = 30UL]",(bool *)local_a8,(bool *)&local_c0);
  local_a8[0] = 1;
  local_c0 = (unsigned_long *)CONCAT44(local_c0._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0x27,"void test_1d_static() [N = 30UL, X = 30UL]",local_a8,(int *)&local_c0);
  local_a8[0] = 0x1e;
  local_c0 = (unsigned_long *)&DAT_0000001e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0x29,"void test_1d_static() [N = 30UL, X = 30UL]",local_a8,(unsigned_long *)&local_c0)
  ;
  local_a8[0] = 0x1e;
  local_c0 = (unsigned_long *)&DAT_0000001e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","X",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0x2a,"void test_1d_static() [N = 30UL, X = 30UL]",local_a8,(unsigned_long *)&local_c0)
  ;
  local_a8[0] = CONCAT71(local_a8[0]._1_7_,1);
  local_c0 = (unsigned_long *)CONCAT71(local_c0._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(sub_l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0x30,"void test_1d_static() [N = 30UL, X = 30UL]",(bool *)local_a8,(bool *)&local_c0);
  local_a8[0] = 0x1e;
  local_c0 = (unsigned_long *)&DAT_0000001e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(0))","N",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0x32,"void test_1d_static() [N = 30UL, X = 30UL]",local_a8,(unsigned_long *)&local_c0)
  ;
  local_a8[0] = 1;
  local_c0 = (unsigned_long *)0x1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.size())","X / N",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0x34,"void test_1d_static() [N = 30UL, X = 30UL]",local_a8,(unsigned_long *)&local_c0)
  ;
  local_a8[0] = 0x1e;
  local_c0 = (unsigned_long *)&DAT_0000001e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.span())","X",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0x35,"void test_1d_static() [N = 30UL, X = 30UL]",local_a8,(unsigned_long *)&local_c0)
  ;
  local_b8._0_4_ = 0;
  do {
    local_c0 = (unsigned_long *)(ulong)(uint)local_b8;
    boost::detail::test_eq_impl<unsigned_long,int>
              ("(l.index(i))","i",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
               ,0x3c,"void test_1d_static() [N = 30UL, X = 30UL]",(unsigned_long *)&local_c0,
               (int *)&local_b8);
    local_c0 = (unsigned_long *)((long)local_a8 + (long)(int)(uint)local_b8 * 4);
    local_b0 = local_c0;
    boost::detail::test_eq_impl<int*,int*>
              ("&(dptr[l.index(i)])","&(dptr[i])",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
               ,0x3e,"void test_1d_static() [N = 30UL, X = 30UL]",(int **)&local_c0,
               (int **)&local_b0);
    t = (int *)((long)local_a8 + (long)(int)(uint)local_b8 * 4);
    *t = 0x2a;
    local_c0 = (unsigned_long *)CONCAT44(local_c0._4_4_,0x2a);
    boost::detail::test_eq_impl<int,int>
              ("(dptr[l.index(i)])","42",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
               ,0x42,"void test_1d_static() [N = 30UL, X = 30UL]",t,(int *)&local_c0);
    local_b8._0_4_ = (uint)local_b8 + 1;
  } while ((uint)local_b8 < 0x1e);
  puVar2 = (unsigned_long *)0x0;
  local_c0 = (unsigned_long *)0x0;
  local_b0 = (unsigned_long *)0x0;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.index(i))","true_idx",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0x4b,"void test_1d_static() [N = 30UL, X = 30UL]",(unsigned_long *)&local_b0,
             (unsigned_long *)&local_c0);
  local_b8 = (int *)((long)local_a8 + (long)local_c0 * 4);
  local_b0 = local_a8;
  boost::detail::test_eq_impl<int*,int*>
            ("&(dptr[sub_l.index(i)])","&(dptr[true_idx])",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0x4d,"void test_1d_static() [N = 30UL, X = 30UL]",(int **)&local_b0,&local_b8);
  local_a8[0] = CONCAT44(local_a8[0]._4_4_,0x11);
  local_b0._0_4_ = 0x11;
  boost::detail::test_eq_impl<int,int>
            ("(dptr[sub_l.index(i)])","17",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0x51,"void test_1d_static() [N = 30UL, X = 30UL]",(int *)local_a8,(int *)&local_b0);
  local_b0._0_4_ = 0;
  do {
    local_c0 = puVar2;
    boost::detail::test_eq_impl<unsigned_long,int>
              ("(l.index(i))","i",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
               ,0x57,"void test_1d_static() [N = 30UL, X = 30UL]",(unsigned_long *)&local_c0,
               (int *)&local_b0);
    uVar1 = (long)(int)(uint)local_b0 * -0x1111111111111111;
    if ((uVar1 >> 1 | (ulong)((uVar1 & 1) != 0) << 0x3f) < 0x888888888888889) {
      local_c0 = (unsigned_long *)CONCAT44(local_c0._4_4_,0x11);
      expr2 = "17";
      line = 0x5c;
    }
    else {
      local_c0 = (unsigned_long *)CONCAT44(local_c0._4_4_,0x2a);
      expr2 = "42";
      line = 0x61;
    }
    boost::detail::test_eq_impl<int,int>
              ("(dptr[l.index(i)])",expr2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
               ,line,"void test_1d_static() [N = 30UL, X = 30UL]",
               (int *)((long)local_a8 + (long)(int)(uint)local_b0 * 4),(int *)&local_c0);
    local_b0._0_4_ = (uint)local_b0 + 1;
    puVar2 = (unsigned_long *)(ulong)(uint)local_b0;
  } while ((uint)local_b0 < 0x1e);
  return;
}

Assistant:

void test_1d_static()
{ // {{{
    static_assert(0 == (X % N), "X must be divisable by N");

    layout_mapping_left<
        dimensions<X>, dimensions<1>, dimensions<0>
    > const l{};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);

    BOOST_TEST_EQ((l.size()), X);
    BOOST_TEST_EQ((l.span()), X);

    layout_mapping_left<
        dimensions<X / N>, dimensions<N>, dimensions<0>
    > const sub_l{};

    BOOST_TEST_EQ((sub_l.is_regular()), true);

    BOOST_TEST_EQ((sub_l.stride(0)), N);

    BOOST_TEST_EQ((sub_l.size()), X / N);
    BOOST_TEST_EQ((sub_l.span()), X);

    int dptr[X];

    // Set all elements to 42.
    for (auto i = 0; i < l[0]; ++i)
    {
        BOOST_TEST_EQ((l.index(i)), i);

        BOOST_TEST_EQ(&(dptr[l.index(i)]), &(dptr[i]));

        dptr[l.index(i)] = 42;

        BOOST_TEST_EQ((dptr[l.index(i)]), 42);
    }

    // Set every Nth element to 17. 
    for (auto i = 0; i < sub_l[0]; ++i)
    {
        auto const s = sub_l.steps();
        auto const true_idx = (s[0] * i);

        BOOST_TEST_EQ((sub_l.index(i)), true_idx);

        BOOST_TEST_EQ(&(dptr[sub_l.index(i)]), &(dptr[true_idx])); 

        dptr[sub_l.index(i)] = 17;

        BOOST_TEST_EQ((dptr[sub_l.index(i)]), 17);
    }

    // Check final structure. 
    for (auto i = 0; i < l[0]; ++i)
    {
        BOOST_TEST_EQ((l.index(i)), i);

        // Element not in the strided sub-box.
        if (0 == (i % sub_l.steps()[0]))
        {
            BOOST_TEST_EQ((dptr[l.index(i)]), 17);
        }
        // Element not in the strided sub-box.
        else
        {
            BOOST_TEST_EQ((dptr[l.index(i)]), 42);
        }
    }
}